

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btInternalEdgeUtility.cpp
# Opt level: O2

bool btClampNormal(btVector3 *edge,btVector3 *tri_normal_org,btVector3 *localContactNormalOnB,
                  btScalar correctedEdgeAngle,btVector3 *clampedLocalNormal)

{
  btVector3 *pbVar1;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 edgeCross;
  btVector3 tri_normal;
  float local_8c;
  btQuaternion local_88;
  btVector3 local_78;
  btVector3 local_68;
  btMatrix3x3 local_50;
  
  local_68.m_floats._0_8_ = *(undefined8 *)tri_normal_org->m_floats;
  local_68.m_floats._8_8_ = *(undefined8 *)(tri_normal_org->m_floats + 2);
  local_50.m_el[0] = btVector3::cross(edge,&local_68);
  pbVar1 = btVector3::normalize(local_50.m_el);
  local_78.m_floats._0_8_ = *(undefined8 *)pbVar1->m_floats;
  local_78.m_floats._8_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
  bVar2 = btGetAngle(&local_78,&local_68,localContactNormalOnB);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= bVar2)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (bVar2 <= correctedEdgeAngle) {
      return false;
    }
  }
  local_8c = correctedEdgeAngle - bVar2;
  btQuaternion::setRotation(&local_88,edge,&local_8c);
  btMatrix3x3::setRotation(&local_50,&local_88);
  bVar3 = operator*(&local_50,localContactNormalOnB);
  *(btVector3 *)clampedLocalNormal->m_floats = bVar3;
  return true;
}

Assistant:

bool	btClampNormal(const btVector3& edge,const btVector3& tri_normal_org,const btVector3& localContactNormalOnB, btScalar correctedEdgeAngle, btVector3 & clampedLocalNormal)
{
	btVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	btVector3 edgeCross = edge.cross(tri_normal).normalize();
	btScalar curAngle = btGetAngle(edgeCross,tri_normal,localContactNormalOnB);

	if (correctedEdgeAngle<0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle>=0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			btScalar diffAngle = correctedEdgeAngle-curAngle;
			btQuaternion rotation(edge,diffAngle );
			clampedLocalNormal = btMatrix3x3(rotation)*localContactNormalOnB;
			return true;
		}
	}
	return false;
}